

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_protocol_connect(connectdata *conn,_Bool *protocol_done)

{
  CURLcode CVar1;
  CURLcode local_24;
  CURLcode result;
  _Bool *protocol_done_local;
  connectdata *conn_local;
  
  local_24 = CURLE_OK;
  *protocol_done = false;
  if ((((conn->bits).tcpconnect[0] & 1U) != 0) && (((conn->bits).protoconnstart & 1U) != 0)) {
    if (conn->handler->connecting == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
    }
    return CURLE_OK;
  }
  if (((conn->bits).protoconnstart & 1U) == 0) {
    CVar1 = Curl_proxy_connect(conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (((((conn->bits).tunnel_proxy & 1U) != 0) && (((conn->bits).httpproxy & 1U) != 0)) &&
       (conn->tunnel_state[0] != TUNNEL_COMPLETE)) {
      return CURLE_OK;
    }
    if (conn->handler->connect_it == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
      local_24 = CURLE_OK;
    }
    else {
      local_24 = (*conn->handler->connect_it)(conn,protocol_done);
    }
    if (local_24 == CURLE_OK) {
      (conn->bits).protoconnstart = true;
    }
  }
  return local_24;
}

Assistant:

CURLcode Curl_protocol_connect(struct connectdata *conn,
                               bool *protocol_done)
{
  CURLcode result=CURLE_OK;

  *protocol_done = FALSE;

  if(conn->bits.tcpconnect[FIRSTSOCKET] && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  if(!conn->bits.protoconnstart) {

    result = Curl_proxy_connect(conn);
    if(result)
      return result;

    if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
       (conn->tunnel_state[FIRSTSOCKET] != TUNNEL_COMPLETE))
      /* when using an HTTP tunnel proxy, await complete tunnel establishment
         before proceeding further. Return CURLE_OK so we'll be called again */
      return CURLE_OK;

    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(conn, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}